

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

bool __thiscall Functions::findFunction(Functions *this,Function *function)

{
  bool bVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  __type _Var4;
  ulong uVar5;
  ulong uVar6;
  string findFID;
  string stackFID;
  _Vector_base<Function_*,_std::allocator<Function_*>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (function != (Function *)0x0) {
    std::vector<Function_*,_std::allocator<Function_*>_>::vector
              ((vector<Function_*,_std::allocator<Function_*>_> *)&local_70,&this->_functionStack);
    sVar3 = local_70._M_string_length;
    _Var2._M_p = local_70._M_dataplus._M_p;
    std::_Vector_base<Function_*,_std::allocator<Function_*>_>::~_Vector_base
              ((_Vector_base<Function_*,_std::allocator<Function_*>_> *)&local_70);
    if (_Var2._M_p != (pointer)sVar3) {
      uVar6 = 0;
      do {
        std::vector<Function_*,_std::allocator<Function_*>_>::vector
                  ((vector<Function_*,_std::allocator<Function_*>_> *)&local_70,
                   &this->_functionStack);
        uVar5 = (long)(local_70._M_string_length - (long)local_70._M_dataplus._M_p) >> 3;
        std::_Vector_base<Function_*,_std::allocator<Function_*>_>::~_Vector_base
                  ((_Vector_base<Function_*,_std::allocator<Function_*>_> *)&local_70);
        bVar1 = uVar6 < uVar5;
        if (uVar5 <= uVar6) {
          return bVar1;
        }
        (*(function->super_Statement)._vptr_Statement[3])(&local_70,function);
        std::vector<Function_*,_std::allocator<Function_*>_>::vector
                  ((vector<Function_*,_std::allocator<Function_*>_> *)&local_88,
                   &this->_functionStack);
        (*(local_88._M_impl.super__Vector_impl_data._M_start[uVar6]->super_Statement).
          _vptr_Statement[3])(&local_50);
        std::_Vector_base<Function_*,_std::allocator<Function_*>_>::~_Vector_base(&local_88);
        _Var4 = std::operator==(&local_70,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        uVar6 = uVar6 + 1;
      } while (!_Var4);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Functions::findFunction(Function *function) {
    if(function == nullptr) return false;
    if(!getFunctionStack().empty()) {
        for (int i = 0; i < getFunctionStack().size(); i++) {
            std::string findFID = function->id();
            std::string stackFID = getFunctionStack()[i]->id();
            if (findFID == stackFID) {
                return true;
            }
        }
    }
    return false;
}